

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::opt::anon_unknown_0::GetWordsFromScalarIntConstant
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          IntConstant *c)

{
  initializer_list<unsigned_int> __l;
  int iVar1;
  Type *pTVar2;
  undefined4 extraout_var;
  bool bVar3;
  allocator<unsigned_int> local_3d;
  uint32_t local_3c;
  iterator local_38;
  size_type local_30;
  uint64_t local_28;
  uint64_t uval;
  ScalarConstant *pSStack_18;
  uint32_t width;
  IntConstant *c_local;
  
  pSStack_18 = &c->super_ScalarConstant;
  c_local = (IntConstant *)__return_storage_ptr__;
  if (c == (IntConstant *)0x0) {
    __assert_fail("c != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x91,
                  "std::vector<uint32_t> spvtools::opt::(anonymous namespace)::GetWordsFromScalarIntConstant(const analysis::IntConstant *)"
                 );
  }
  pTVar2 = analysis::Constant::type((Constant *)c);
  iVar1 = (*pTVar2->_vptr_Type[10])();
  uval._4_4_ = analysis::Integer::width((Integer *)CONCAT44(extraout_var,iVar1));
  bVar3 = true;
  if (((uval._4_4_ != 8) && (bVar3 = true, uval._4_4_ != 0x10)) &&
     (bVar3 = true, uval._4_4_ != 0x20)) {
    bVar3 = uval._4_4_ == 0x40;
  }
  if (!bVar3) {
    __assert_fail("width == 8 || width == 16 || width == 32 || width == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x93,
                  "std::vector<uint32_t> spvtools::opt::(anonymous namespace)::GetWordsFromScalarIntConstant(const analysis::IntConstant *)"
                 );
  }
  if (uval._4_4_ == 0x40) {
    local_28 = analysis::Constant::GetU64(&pSStack_18->super_Constant);
    ExtractInts(__return_storage_ptr__,local_28);
  }
  else {
    local_3c = analysis::ScalarConstant::GetU32BitValue(pSStack_18);
    local_38 = &local_3c;
    local_30 = 1;
    std::allocator<unsigned_int>::allocator(&local_3d);
    __l._M_len = local_30;
    __l._M_array = local_38;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l,&local_3d);
    std::allocator<unsigned_int>::~allocator(&local_3d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> GetWordsFromScalarIntConstant(
    const analysis::IntConstant* c) {
  assert(c != nullptr);
  uint32_t width = c->type()->AsInteger()->width();
  assert(width == 8 || width == 16 || width == 32 || width == 64);
  if (width == 64) {
    uint64_t uval = static_cast<uint64_t>(c->GetU64());
    return ExtractInts(uval);
  }
  // Section 2.2.1 of the SPIR-V spec guarantees that all integer types
  // smaller than 32-bits are automatically zero or sign extended to 32-bits.
  return {c->GetU32BitValue()};
}